

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_us * stbi_load_16_from_memory
                    (stbi_uc *buffer,int len,int *x,int *y,int *channels_in_file,
                    int desired_channels)

{
  stbi__uint16 *psVar1;
  undefined1 local_e8 [8];
  stbi__context s;
  
  s.img_n = 0;
  s.img_out_n = 0;
  s.io_user_data._0_4_ = 0;
  s.buffer_start[0x78] = '\0';
  s.buffer_start[0x79] = '\0';
  s.buffer_start[0x7a] = '\0';
  s.buffer_start[0x7b] = '\0';
  s.img_buffer = buffer + len;
  s._184_8_ = buffer;
  s.img_buffer_end = buffer;
  s.img_buffer_original = s.img_buffer;
  psVar1 = stbi__load_and_postprocess_16bit
                     ((stbi__context *)local_e8,x,y,channels_in_file,desired_channels);
  return psVar1;
}

Assistant:

STBIDEF stbi_us *stbi_load_16_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *channels_in_file, int desired_channels)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__load_and_postprocess_16bit(&s,x,y,channels_in_file,desired_channels);
}